

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  path *ppVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  path *__p;
  bool bVar9;
  undefined1 auVar10 [16];
  path ext;
  string platp;
  string output_path;
  string backgr_path;
  string plates_path;
  directory_iterator local_1d0;
  directory_iterator local_1c0;
  path local_1b0;
  string local_188;
  undefined1 *local_168;
  long local_160;
  undefined1 local_158;
  undefined7 uStack_157;
  string local_148;
  string local_128;
  double local_108;
  string_type local_100;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  path local_80;
  path local_58;
  
  if (argc < 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Usage: datset /path/to/plates/ /path/to/background/ ./output_path output_image_size scale_factor number_of_warps\n"
               ,0x71);
    iVar5 = -1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,argv[1],(allocator<char> *)&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,argv[2],(allocator<char> *)&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,argv[3],(allocator<char> *)&local_1b0);
    iVar5 = atoi(argv[4]);
    local_108 = atof(argv[5]);
    local_168 = &local_158;
    local_160 = 0;
    local_158 = 0;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_1b0,&local_a0,auto_format);
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              (&local_1c0,&local_1b0,none,(error_code *)0x0);
    std::filesystem::__cxx11::path::~path(&local_1b0);
    if (local_1c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_1c0._M_dir._M_refcount._M_pi + 8) =
             *(int *)(local_1c0._M_dir._M_refcount._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_1c0._M_dir._M_refcount._M_pi + 8) =
             *(int *)(local_1c0._M_dir._M_refcount._M_pi + 8) + 1;
      }
    }
    local_1d0._M_dir._M_ptr = local_1c0._M_dir._M_ptr;
    local_1d0._M_dir._M_refcount._M_pi = local_1c0._M_dir._M_refcount._M_pi;
    if (local_1c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_1c0._M_dir._M_refcount._M_pi + 8) =
             *(int *)(local_1c0._M_dir._M_refcount._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_1c0._M_dir._M_refcount._M_pi + 8) =
             *(int *)(local_1c0._M_dir._M_refcount._M_pi + 8) + 1;
      }
      if (local_1c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1c0._M_dir._M_refcount._M_pi);
      }
    }
    while( true ) {
      if (local_1d0._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      break;
      ppVar7 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_1d0);
      sVar2 = (ppVar7->_M_pathname)._M_string_length;
      if (sVar2 == 0) {
LAB_001085ba:
        std::filesystem::__cxx11::path::path(&local_80);
      }
      else {
        uVar3 = *(ulong *)&ppVar7->_M_cmpts;
        __p = ppVar7;
        if ((~(byte)uVar3 & 3) != 0) {
          if (((uVar3 & 3) == 0) && ((ppVar7->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
            if ((uVar3 & 3) == 0) {
              lVar8 = std::filesystem::__cxx11::path::_List::end();
            }
            else {
              lVar8 = 0;
            }
            if (((byte)ppVar7->_M_cmpts & 3) == 0) {
              __p = (path *)(lVar8 + -0x30);
            }
            if ((~*(uint *)&__p->_M_cmpts & 3) == 0) goto LAB_001085b0;
          }
          goto LAB_001085ba;
        }
LAB_001085b0:
        std::filesystem::__cxx11::path::path(&local_80,__p);
      }
      auVar10 = std::filesystem::__cxx11::path::_M_find_extension();
      if (auVar10._8_8_ == -1 || auVar10._0_8_ == 0) {
        std::filesystem::__cxx11::path::path(&local_1b0);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_100,auVar10._0_8_);
        std::filesystem::__cxx11::path::path(&local_1b0,&local_100,auto_format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
      }
      std::filesystem::__cxx11::path::~path(&local_80);
      std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                (&local_80,(char (*) [5])".jpg",auto_format);
      iVar6 = std::filesystem::__cxx11::path::compare(&local_1b0);
      if (iVar6 == 0) {
        bVar9 = true;
      }
      else {
        std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                  (&local_58,(char (*) [5])".png",auto_format);
        iVar6 = std::filesystem::__cxx11::path::compare(&local_1b0);
        bVar9 = iVar6 == 0;
        std::filesystem::__cxx11::path::~path(&local_58);
      }
      std::filesystem::__cxx11::path::~path(&local_80);
      paVar1 = &local_80._M_pathname.field_2;
      if (bVar9) {
        pcVar4 = (ppVar7->_M_pathname)._M_dataplus._M_p;
        local_80._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar4,pcVar4 + (ppVar7->_M_pathname)._M_string_length);
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_pathname._M_dataplus._M_p,
                          local_80._M_pathname.field_2._M_allocated_capacity + 1);
        }
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,local_168,local_168 + local_160);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,local_c0,local_b8 + (long)local_c0);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_e0,local_d8 + (long)local_e0);
        generateDatasetImages(&local_128,&local_188,&local_148,iVar5,local_108,5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      std::filesystem::__cxx11::path::~path(&local_1b0);
      std::filesystem::__cxx11::directory_iterator::operator++(&local_1d0);
    }
    if (local_1c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c0._M_dir._M_refcount._M_pi);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int main(int argc, char const *argv[]) {
    if (argc<6) {
        cout<<"Usage: datset /path/to/plates/ /path/to/background/ ./output_path output_image_size scale_factor number_of_warps\n";
        return -1;
    }

    string plates_path = string(argv[1]);
    string backgr_path = string(argv[2]);
    string output_path = string(argv[3]);
    int image_size = atoi(argv[4]);
    double plate_scale = atof(argv[5]);

    string platp;
    for (const auto & entry : filesystem::directory_iterator(plates_path)) {
        auto ext = entry.path().filename().extension();
        if (ext == ".jpg" || ext ==".png") { 
            platp = entry.path();
            generateDatasetImages(platp, backgr_path, output_path,  image_size, plate_scale, 5);
        }
    } 
    return 0;
}